

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int channel_mix_1_0_to_2_0(mixed_segment *segment)

{
  float fVar1;
  undefined8 *puVar2;
  uint32_t i;
  ulong uVar3;
  uint32_t frames;
  float *in;
  float *r;
  float *l;
  
  puVar2 = (undefined8 *)segment->data;
  frames = 0xffffffff;
  mixed_buffer_request_write(&l,&frames,(mixed_buffer *)puVar2[0xe]);
  mixed_buffer_request_write(&r,&frames,(mixed_buffer *)puVar2[0xf]);
  mixed_buffer_request_read(&in,&frames,(mixed_buffer *)*puVar2);
  for (uVar3 = 0; frames != uVar3; uVar3 = uVar3 + 1) {
    fVar1 = in[uVar3];
    l[uVar3] = fVar1;
    r[uVar3] = fVar1;
  }
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar2[0xe]);
  mixed_buffer_finish_write(frames,(mixed_buffer *)puVar2[0xf]);
  mixed_buffer_finish_read(frames,(mixed_buffer *)*puVar2);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_1_0_to_2_0(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict in;
  mixed_buffer_request_write(&l, &frames, data->out[MIXED_LEFT]);
  mixed_buffer_request_write(&r, &frames, data->out[MIXED_RIGHT]);
  mixed_buffer_request_read(&in, &frames, data->in[MIXED_MONO]);
  for(uint32_t i=0; i<frames; ++i){
    l[i] = in[i];
    r[i] = in[i];
  }
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_MONO]);
  
  return 1;
}